

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall
CVmImagePool::set_page_info
          (CVmImagePool *this,ulong page_idx,long seek_pos,size_t page_size,uchar xor_mask)

{
  CVmImagePool_pg *pCVar1;
  uint uVar2;
  
  if (this->page_info_ == (CVmImagePool_pg **)0x0) {
    err_throw(0x133);
  }
  if (page_idx < this->page_count_) {
    pCVar1 = this->page_info_[page_idx >> 0xc];
    uVar2 = (uint)page_idx & 0xfff;
    pCVar1[uVar2].seek_pos = seek_pos;
    pCVar1[uVar2].page_size = page_size;
    pCVar1[uVar2].xor_mask = xor_mask;
    return;
  }
  err_throw(0x134);
}

Assistant:

void CVmImagePool::set_page_info(ulong page_idx, long seek_pos,
                                 size_t page_size, uchar xor_mask)
{
    CVmImagePool_pg *info;
    
    /* 
     *   make sure we've allocated the page array and that this index is
     *   in range -- throw an error if not 
     */
    if (page_info_ == 0)
        err_throw(VMERR_IMAGE_POOL_BEFORE_DEF);
    if (page_idx >= page_count_)
        err_throw(VMERR_IMAGE_POOL_BAD_PAGE);

    /* get the entry for this page */
    info = get_page_info(page_idx);

    /* set the information */
    info->seek_pos = seek_pos;
    info->page_size = page_size;
    info->xor_mask = xor_mask;
}